

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationbutton.cpp
# Opt level: O2

void __thiscall
QtMWidgets::NavigationButton::NavigationButton
          (NavigationButton *this,Direction direction,QString *text,QWidget *parent)

{
  NavigationButtonPrivate *this_00;
  NavigationButton *ctx;
  Object local_38 [8];
  Object local_30 [8];
  
  QAbstractButton::QAbstractButton(&this->super_QAbstractButton,parent);
  *(undefined ***)this = &PTR_metaObject_001a7d68;
  *(undefined ***)&this->field_0x10 = &PTR__NavigationButton_001a7f30;
  this_00 = (NavigationButtonPrivate *)operator_new(0x40);
  ctx = this;
  NavigationButtonPrivate::NavigationButtonPrivate(this_00,this,direction);
  (this->d).d = this_00;
  NavigationButtonPrivate::init(this_00,(EVP_PKEY_CTX *)ctx);
  QAbstractButton::setText((QString *)this);
  QObject::connect<void(QAbstractButton::*)(),void(QtMWidgets::NavigationButton::*)()>
            (local_30,(offset_in_QAbstractButton_to_subr)this,(Object *)QAbstractButton::pressed,0,
             (ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_30);
  QObject::connect<void(QAbstractButton::*)(),void(QtMWidgets::NavigationButton::*)()>
            (local_38,(offset_in_QAbstractButton_to_subr)this,(Object *)QAbstractButton::released,0,
             (ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  return;
}

Assistant:

NavigationButton::NavigationButton( Direction direction, const QString & text,
	QWidget * parent )
	:	QAbstractButton( parent )
	,	d( new NavigationButtonPrivate( this, direction ) )
{
	d->init();

	setText( text );

	connect( this, &QAbstractButton::pressed,
		this, &NavigationButton::_q_pressed );
	connect( this, &QAbstractButton::released,
		this, &NavigationButton::_q_released );
}